

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clip_x86_avx2.cpp
# Opt level: O0

int __thiscall
ncnn::Clip_x86_avx2::forward_inplace(Clip_x86_avx2 *this,Mat *bottom_top_blob,Option *opt)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined1 auVar8 [32];
  undefined1 (*pauVar9) [16];
  float *pfVar10;
  long in_RSI;
  long *in_RDI;
  undefined1 auVar11 [32];
  int remain;
  float *ptr_2;
  int q_2;
  __m128 _ptr_1;
  int i_1;
  __m128 _min_1;
  __m128 _max_1;
  float *ptr_1;
  int q_1;
  __m256 _ptr;
  int i;
  __m256 _min;
  __m256 _max;
  float *ptr;
  int q;
  int elempack;
  int size;
  int channels;
  int h;
  int w;
  undefined8 in_stack_fffffffffffffb88;
  Mat *this_00;
  Mat *in_stack_fffffffffffffb90;
  int local_45c;
  Mat local_458;
  float *local_410;
  int local_404;
  undefined1 local_400 [16];
  int local_3e4;
  undefined8 local_3e0;
  undefined8 uStack_3d8;
  undefined8 local_3d0;
  undefined8 uStack_3c8;
  Mat local_3b8;
  undefined1 (*local_370) [16];
  int local_364;
  undefined1 local_360 [16];
  size_t sStack_350;
  undefined8 uStack_348;
  int local_324;
  undefined8 local_320;
  undefined8 uStack_318;
  undefined8 uStack_310;
  undefined8 uStack_308;
  undefined8 local_300;
  undefined8 uStack_2f8;
  undefined8 uStack_2f0;
  undefined8 uStack_2e8;
  Mat local_2b8;
  Mat *local_270;
  int local_268;
  int local_264;
  int local_260;
  int local_25c;
  int local_258;
  int local_254;
  uint local_230;
  uint local_22c;
  Mat *local_228;
  undefined8 local_220;
  undefined8 uStack_218;
  undefined8 uStack_210;
  undefined8 uStack_208;
  undefined8 local_200;
  undefined8 uStack_1f8;
  undefined8 uStack_1f0;
  undefined8 uStack_1e8;
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  undefined8 uStack_1d0;
  undefined8 uStack_1c8;
  undefined8 local_1c0;
  undefined8 uStack_1b8;
  undefined8 uStack_1b0;
  undefined8 uStack_1a8;
  void *local_1a0;
  int *piStack_198;
  size_t sStack_190;
  undefined8 uStack_188;
  Mat *local_168;
  undefined4 local_160;
  undefined4 uStack_15c;
  undefined4 uStack_158;
  undefined4 uStack_154;
  undefined4 local_144;
  undefined4 local_140;
  undefined4 uStack_13c;
  undefined4 uStack_138;
  undefined4 uStack_134;
  undefined4 local_12c;
  undefined1 (*local_128) [16];
  undefined8 local_120;
  undefined8 uStack_118;
  undefined8 local_110;
  undefined8 uStack_108;
  undefined8 local_100;
  undefined8 uStack_f8;
  undefined8 local_f0;
  undefined8 uStack_e8;
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined1 (*local_c8) [16];
  undefined1 local_c0 [16];
  undefined1 auStack_b0 [16];
  uint local_a0;
  uint local_9c;
  uint local_98;
  uint local_94;
  uint local_90;
  uint local_8c;
  uint local_88;
  uint local_84;
  undefined1 local_80 [32];
  uint local_50;
  uint local_4c;
  uint local_48;
  uint local_44;
  uint local_40;
  uint local_3c;
  uint local_38;
  uint local_34;
  
  local_254 = *(int *)(in_RSI + 0x2c);
  local_258 = *(int *)(in_RSI + 0x30);
  local_25c = *(int *)(in_RSI + 0x38);
  local_260 = local_254 * local_258;
  local_264 = *(int *)(in_RSI + 0x18);
  if (local_264 == 8) {
    local_264 = 8;
    for (local_268 = 0; local_268 < local_25c; local_268 = local_268 + 1) {
      this_00 = &local_2b8;
      ncnn::Mat::channel(in_stack_fffffffffffffb90,(int)((ulong)this_00 >> 0x20));
      in_stack_fffffffffffffb90 = (Mat *)ncnn::Mat::operator_cast_to_float_(this_00);
      ncnn::Mat::~Mat((Mat *)0x6bd121);
      local_22c = *(uint *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4);
      auVar1 = vinsertps_avx(ZEXT416(local_22c),ZEXT416(local_22c),0x10);
      auVar1 = vinsertps_avx(auVar1,ZEXT416(local_22c),0x20);
      local_c0 = vinsertps_avx(auVar1,ZEXT416(local_22c),0x30);
      auVar1 = vinsertps_avx(ZEXT416(local_22c),ZEXT416(local_22c),0x10);
      auVar1 = vinsertps_avx(auVar1,ZEXT416(local_22c),0x20);
      auStack_b0 = vinsertps_avx(auVar1,ZEXT416(local_22c),0x30);
      local_300 = local_c0._0_8_;
      uStack_2f8 = local_c0._8_8_;
      uStack_2f0 = auStack_b0._0_8_;
      uStack_2e8 = auStack_b0._8_8_;
      local_230 = *(uint *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0);
      auVar1 = vinsertps_avx(ZEXT416(local_230),ZEXT416(local_230),0x10);
      auVar1 = vinsertps_avx(auVar1,ZEXT416(local_230),0x20);
      auVar1 = vinsertps_avx(auVar1,ZEXT416(local_230),0x30);
      auVar2 = vinsertps_avx(ZEXT416(local_230),ZEXT416(local_230),0x10);
      auVar2 = vinsertps_avx(auVar2,ZEXT416(local_230),0x20);
      auVar2 = vinsertps_avx(auVar2,ZEXT416(local_230),0x30);
      auVar11._16_16_ = auVar1;
      auVar11._0_16_ = auVar2;
      local_80._0_8_ = auVar2._0_8_;
      local_80._8_8_ = auVar2._8_8_;
      local_80._16_8_ = auVar1._0_8_;
      local_80._24_8_ = auVar1._8_8_;
      local_320 = local_80._0_8_;
      uStack_318 = local_80._8_8_;
      uStack_310 = local_80._16_8_;
      uStack_308 = local_80._24_8_;
      local_270 = in_stack_fffffffffffffb90;
      for (local_324 = 0; local_324 < local_260; local_324 = local_324 + 1) {
        local_228 = local_270;
        uVar5 = local_270->data;
        uVar6 = local_270->refcount;
        uVar7 = local_270->elemsize;
        uStack_1e8 = *(undefined8 *)&local_270->elempack;
        auVar8._0_8_ = local_270->data;
        auVar8._8_8_ = local_270->refcount;
        auVar8._16_8_ = local_270->elemsize;
        auVar8._24_4_ = local_270->elempack;
        auVar8._28_4_ = *(undefined4 *)&local_270->field_0x1c;
        local_200 = uVar5;
        uStack_1f8 = uVar6;
        uStack_1f0 = uVar7;
        local_220 = local_80._0_8_;
        uStack_218 = local_80._8_8_;
        uStack_210 = local_80._16_8_;
        uStack_208 = local_80._24_8_;
        auVar3._16_8_ = local_80._16_8_;
        auVar3._0_16_ = auVar2;
        auVar3._24_8_ = local_80._24_8_;
        auVar3 = vmaxps_avx(auVar8,auVar3);
        local_360._0_8_ = auVar3._0_8_;
        local_1c0 = local_360._0_8_;
        local_360._8_8_ = auVar3._8_8_;
        uStack_1b8 = local_360._8_8_;
        sStack_350 = auVar3._16_8_;
        uStack_1b0 = sStack_350;
        uStack_348 = auVar3._24_8_;
        uStack_1a8 = uStack_348;
        local_1e0 = local_c0._0_8_;
        uStack_1d8 = local_c0._8_8_;
        uStack_1d0 = auStack_b0._0_8_;
        uStack_1c8 = auStack_b0._8_8_;
        auVar4._16_8_ = auStack_b0._0_8_;
        auVar4._0_16_ = local_c0;
        auVar4._24_8_ = auStack_b0._8_8_;
        _local_360 = vminps_avx(auVar3,auVar4);
        local_168 = local_270;
        local_1a0 = (void *)local_360._0_8_;
        piStack_198 = (int *)local_360._8_8_;
        sStack_190 = sStack_350;
        uStack_188 = uStack_348;
        local_270->data = (void *)local_360._0_8_;
        local_270->refcount = (int *)local_360._8_8_;
        local_270->elemsize = sStack_350;
        *(undefined8 *)&local_270->elempack = uStack_348;
        local_270 = (Mat *)&local_270->allocator;
      }
      local_a0 = local_22c;
      local_9c = local_22c;
      local_98 = local_22c;
      local_94 = local_22c;
      local_90 = local_22c;
      local_8c = local_22c;
      local_88 = local_22c;
      local_84 = local_22c;
      local_80 = auVar11;
      local_50 = local_230;
      local_4c = local_230;
      local_48 = local_230;
      local_44 = local_230;
      local_40 = local_230;
      local_3c = local_230;
      local_38 = local_230;
      local_34 = local_230;
    }
  }
  else if (local_264 == 4) {
    local_264 = 4;
    for (local_364 = 0; local_364 < local_25c; local_364 = local_364 + 1) {
      ncnn::Mat::channel(in_stack_fffffffffffffb90,(int)((ulong)in_stack_fffffffffffffb88 >> 0x20));
      pauVar9 = (undefined1 (*) [16])ncnn::Mat::operator_cast_to_float_(&local_3b8);
      ncnn::Mat::~Mat((Mat *)0x6bd519);
      local_140 = *(undefined4 *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4);
      local_3d0 = CONCAT44(local_140,local_140);
      uStack_3c8 = CONCAT44(local_140,local_140);
      local_160 = *(undefined4 *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0);
      local_3e0 = CONCAT44(local_160,local_160);
      uStack_3d8 = CONCAT44(local_160,local_160);
      local_370 = pauVar9;
      for (local_3e4 = 0; local_3e4 < local_260; local_3e4 = local_3e4 + 1) {
        local_128 = local_370;
        local_110 = *(undefined8 *)*local_370;
        uStack_108 = *(undefined8 *)(*local_370 + 8);
        auVar1._8_8_ = uStack_3d8;
        auVar1._0_8_ = local_3e0;
        auVar1 = vmaxps_avx(*local_370,auVar1);
        local_400._0_8_ = auVar1._0_8_;
        local_f0 = local_400._0_8_;
        local_400._8_8_ = auVar1._8_8_;
        uStack_e8 = local_400._8_8_;
        auVar2._8_8_ = uStack_3c8;
        auVar2._0_8_ = local_3d0;
        local_400 = vminps_avx(auVar1,auVar2);
        local_c8 = local_370;
        local_e0 = local_400._0_8_;
        uStack_d8 = local_400._8_8_;
        *(undefined8 *)*local_370 = local_400._0_8_;
        *(undefined8 *)(*local_370 + 8) = local_400._8_8_;
        local_370 = local_370 + 1;
        local_120 = local_3e0;
        uStack_118 = uStack_3d8;
        local_100 = local_3d0;
        uStack_f8 = uStack_3c8;
      }
      uStack_15c = local_160;
      uStack_158 = local_160;
      uStack_154 = local_160;
      local_144 = local_160;
      uStack_13c = local_140;
      uStack_138 = local_140;
      uStack_134 = local_140;
      local_12c = local_140;
    }
  }
  else {
    for (local_404 = 0; local_404 < local_25c; local_404 = local_404 + 1) {
      ncnn::Mat::channel(in_stack_fffffffffffffb90,(int)((ulong)in_stack_fffffffffffffb88 >> 0x20));
      pfVar10 = ncnn::Mat::operator_cast_to_float_(&local_458);
      ncnn::Mat::~Mat((Mat *)0x6bd776);
      local_410 = pfVar10;
      for (local_45c = local_260; 0 < local_45c; local_45c = local_45c + -1) {
        if (*local_410 < *(float *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0)) {
          *local_410 = *(float *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0);
        }
        if (*(float *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4) < *local_410) {
          *local_410 = *(float *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4);
        }
        local_410 = local_410 + 1;
      }
    }
  }
  return 0;
}

Assistant:

int Clip_x86_avx2::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int channels = bottom_top_blob.c;
    int size = w * h;
#if __SSE2__
    int elempack = bottom_top_blob.elempack;

#if __AVX__
    if (elempack == 8)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);

            __m256 _max = _mm256_set1_ps(max);
            __m256 _min = _mm256_set1_ps(min);

            for (int i = 0; i < size; i++)
            {
                __m256 _ptr = _mm256_loadu_ps(ptr);
                _ptr = _mm256_max_ps(_ptr, _min);
                _ptr = _mm256_min_ps(_ptr, _max);
                _mm256_storeu_ps(ptr, _ptr);

                ptr += 8;
            }
        }

        return 0;
    }
#endif // __AVX__

    if (elempack == 4)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);

            __m128 _max = _mm_set1_ps(max);
            __m128 _min = _mm_set1_ps(min);

            for (int i = 0; i < size; i++)
            {
                __m128 _ptr = _mm_loadu_ps(ptr);
                _ptr = _mm_max_ps(_ptr, _min);
                _ptr = _mm_min_ps(_ptr, _max);
                _mm_storeu_ps(ptr, _ptr);

                ptr += 4;
            }
        }

        return 0;
    }
#endif // __SSE2__

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = bottom_top_blob.channel(q);

        int remain = size;
        for (; remain > 0; remain--)
        {
            if (*ptr < min)
                *ptr = min;

            if (*ptr > max)
                *ptr = max;

            ptr++;
        }
    }

    return 0;
}